

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult *
iuutil::CmpHelperIsNan<long_double>
          (AssertionResult *__return_storage_ptr__,char *actual_str,longdouble *actual)

{
  AssertionResult *pAVar1;
  char *local_40;
  AssertionResult local_38;
  
  if (((uint)(float)*actual & 0x7fffff) == 0 || (~(uint)(float)*actual & 0x7f800000) != 0) {
    local_38.m_message._M_dataplus._M_p = (pointer)&local_38.m_message.field_2;
    local_38.m_message._M_string_length = 0;
    local_38.m_message.field_2._M_local_buf[0] = '\0';
    local_38.m_result = false;
    local_40 = actual_str;
    pAVar1 = iutest::AssertionResult::operator<<(&local_38,(char (*) [18])"error: Value of: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_40);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])"\n  Actual: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,actual);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [15])"\nExpected: NaN");
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperIsNan(const char* actual_str, const T& actual)
{
    if( floationg_point_helper::CastToFloatingPoint(actual).is_nan() )
    {
        return ::iutest::AssertionSuccess();
    }
    return ::iutest::AssertionFailure() << "error: Value of: " << actual_str
        << "\n  Actual: " << actual << "\nExpected: NaN";
}